

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLoader.c
# Opt level: O0

UINT8 DataLoader_Load(DATA_LOADER *loader)

{
  UINT32 UVar1;
  UINT8 ret;
  DATA_LOADER *loader_local;
  
  if (loader->_status == '\x01') {
    loader_local._7_1_ = '\x01';
  }
  else {
    DataLoader_Reset(loader);
    loader_local._7_1_ = (*loader->_callbacks->dopen)(loader->_context);
    if (loader_local._7_1_ == '\0') {
      loader->_bytesLoaded = 0;
      loader->_status = '\x01';
      UVar1 = (*loader->_callbacks->dlength)(loader->_context);
      loader->_bytesTotal = UVar1;
      if (loader->_readStopOfs != 0) {
        DataLoader_Read(loader,loader->_readStopOfs);
      }
      loader_local._7_1_ = '\0';
    }
  }
  return loader_local._7_1_;
}

Assistant:

UINT8 DataLoader_Load(DATA_LOADER *loader)
{
	UINT8 ret;
	if (loader->_status == DLSTAT_LOADING)
		return 0x01;

	DataLoader_Reset(loader);

	ret = loader->_callbacks->dopen(loader->_context);
	if(ret) return ret;

	loader->_bytesLoaded = 0x00;
	loader->_status = DLSTAT_LOADING;
	loader->_bytesTotal = loader->_callbacks->dlength(loader->_context);

	if (loader->_readStopOfs > 0)
		DataLoader_Read(loader,loader->_readStopOfs);

	return 0x00;
}